

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Cord::Cord(Cord *this,string_view src,MethodIdentifier method)

{
  size_type length;
  const_pointer pvVar1;
  Nullable<CordRep_*> rep_00;
  CordRep *rep;
  size_t n;
  MethodIdentifier method_local;
  Cord *this_local;
  string_view src_local;
  
  src_local._M_len = (size_t)src._M_str;
  this_local = (Cord *)src._M_len;
  InlineRep::InlineRep(&this->contents_,kDefaultInit);
  length = std::basic_string_view<char,_std::char_traits<char>_>::size
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (length < 0x10) {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    InlineRep::set_data(&this->contents_,pvVar1,length);
  }
  else {
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    rep_00 = NewTree(pvVar1,length,0);
    InlineRep::EmplaceTree(&this->contents_,rep_00,method);
  }
  return;
}

Assistant:

Cord::Cord(absl::string_view src, MethodIdentifier method)
    : contents_(InlineData::kDefaultInit) {
  const size_t n = src.size();
  if (n <= InlineRep::kMaxInline) {
    contents_.set_data(src.data(), n);
  } else {
    CordRep* rep = NewTree(src.data(), n, 0);
    contents_.EmplaceTree(rep, method);
  }
}